

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFindNet(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  int ObjId;
  Abc_Obj_t *pNet;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 != 0) {
    iVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,6);
    if (iVar1 == -1) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = (Abc_Ntk_t *)Abc_NtkObj(pNtk,iVar1);
    }
    return (Abc_Obj_t *)pNtk_local;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x206,"Abc_Obj_t *Abc_NtkFindNet(Abc_Ntk_t *, char *)");
}

Assistant:

Abc_Obj_t * Abc_NtkFindNet( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet;
    int ObjId;
    assert( Abc_NtkIsNetlist(pNtk) );
    ObjId = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_NET );
    if ( ObjId == -1 )
        return NULL;
    pNet = Abc_NtkObj( pNtk, ObjId );
    return pNet;
}